

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::checkGroupCountFixture::checkGroupCountFixture
          (checkGroupCountFixture *this)

{
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  DataDictionary local_430 [8];
  DataDictionary groupDD;
  allocator<char> local_31;
  string local_30;
  checkGroupCountFixture *local_10;
  checkGroupCountFixture *this_local;
  
  local_10 = this;
  FIX::DataDictionary::DataDictionary(&this->object);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"FIX.4.2",&local_31);
  FIX::DataDictionary::setVersion(&this->object,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  FIX::DataDictionary::addField(&this->object,8);
  FIX::DataDictionary::addField(&this->object,9);
  FIX::DataDictionary::addField(&this->object,0x23);
  FIX::DataDictionary::addField(&this->object,10);
  FIX::DataDictionary::addField(&this->object,0x4e);
  FIX::DataDictionary::DataDictionary(local_430);
  FIX::DataDictionary::addField(local_430,0x4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"D",&local_451);
  FIX::DataDictionary::addGroup(&this->object,&local_450,0x4e,0x4f,local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"D",&local_479);
  FIX::DataDictionary::addMsgType(&this->object,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"D",&local_4a1);
  FIX::DataDictionary::addMsgField(&this->object,&local_4a0,0x4e);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  FIX::DataDictionary::~DataDictionary(local_430);
  return;
}

Assistant:

checkGroupCountFixture()
  {
    object.setVersion( BeginString_FIX42 );
    object.addField( FIELD::BeginString );
    object.addField( FIELD::BodyLength );
    object.addField( FIELD::MsgType );
    object.addField( FIELD::CheckSum );
    object.addField( FIELD::NoAllocs );
    DataDictionary groupDD;
    groupDD.addField( FIELD::AllocAccount );
    object.addGroup( "D", FIELD::NoAllocs, FIELD::AllocAccount, groupDD );
    object.addMsgType( MsgType_NewOrderSingle );
    object.addMsgField( MsgType_NewOrderSingle, FIELD::NoAllocs );
  }